

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

void __thiscall
testing::internal::
ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::
AddTestPattern(ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>
               *this,char *param_1,char *test_base_name,TestMetaFactoryBase<bool> *meta_factory,
              CodeLocation *code_location)

{
  TestMetaFactoryBase<bool> *pTVar1;
  pointer *ppsVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__a;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  ulong uVar4;
  pointer psVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>
  *extraout_RDX;
  ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>
  *pPVar7;
  pointer psVar8;
  ulong uVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  ulong uVar11;
  allocator<char> local_71;
  ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>
  *local_70;
  TestMetaFactoryBase<bool> *local_68;
  _func_int **local_60;
  TestMetaFactoryBase<bool> local_58;
  _func_int **pp_Stack_50;
  int local_48;
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo>
  local_40;
  
  local_70 = this;
  local_40.
  super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)operator_new(0x50);
  local_68 = &local_58;
  pTVar1 = meta_factory + 2;
  if ((TestMetaFactoryBase<bool> *)meta_factory->_vptr_TestMetaFactoryBase == pTVar1) {
    local_58._vptr_TestMetaFactoryBase = pTVar1->_vptr_TestMetaFactoryBase;
    pp_Stack_50 = meta_factory[3]._vptr_TestMetaFactoryBase;
  }
  else {
    local_58._vptr_TestMetaFactoryBase = pTVar1->_vptr_TestMetaFactoryBase;
    local_68 = (TestMetaFactoryBase<bool> *)meta_factory->_vptr_TestMetaFactoryBase;
  }
  local_60 = meta_factory[1]._vptr_TestMetaFactoryBase;
  meta_factory->_vptr_TestMetaFactoryBase = (_func_int **)pTVar1;
  meta_factory[1]._vptr_TestMetaFactoryBase = (_func_int **)0x0;
  *(undefined1 *)&meta_factory[2]._vptr_TestMetaFactoryBase = 0;
  local_48 = *(int *)&meta_factory[4]._vptr_TestMetaFactoryBase;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             local_40.
             super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,param_1,&local_71);
  ((local_40.
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->test_meta_factory)._M_t.
  super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<bool>,_std::default_delete<testing::internal::TestMetaFactoryBase<bool>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<bool>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<bool>_>_>
  .super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<bool>_*,_false>._M_head_impl =
       (TestMetaFactoryBase<bool> *)test_base_name;
  paVar10 = &((local_40.
               super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->code_location).file.field_2;
  ((local_40.
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->code_location).file._M_dataplus._M_p = (pointer)paVar10;
  if (local_68 == &local_58) {
    paVar10->_M_allocated_capacity = (size_type)local_58._vptr_TestMetaFactoryBase;
    *(_func_int ***)
     ((long)&((local_40.
               super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->code_location).file.field_2 + 8) = pp_Stack_50;
  }
  else {
    ((local_40.
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
     ._M_ptr)->code_location).file._M_dataplus._M_p = (pointer)local_68;
    ((local_40.
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
     ._M_ptr)->code_location).file.field_2._M_allocated_capacity =
         (size_type)local_58._vptr_TestMetaFactoryBase;
  }
  ((local_40.
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->code_location).file._M_string_length = (size_type)local_60;
  local_60 = (_func_int **)0x0;
  local_58._vptr_TestMetaFactoryBase = local_58._vptr_TestMetaFactoryBase & 0xffffffffffffff00;
  ((local_40.
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->code_location).line = local_48;
  __a = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        (local_70->tests_).
        super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_finish;
  local_68 = &local_58;
  if (__a == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (local_70->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_40.
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (local_70->tests_).
         super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    if ((long)__a -
        (long)local_40.
              super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi == 0x7ffffffffffffff0) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar9 = (long)__a -
            (long)local_40.
                  super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi >> 4;
    uVar4 = 1;
    if (__a != local_40.
               super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi) {
      uVar4 = uVar9;
    }
    uVar11 = uVar4 + uVar9;
    if (0x7fffffffffffffe < uVar11) {
      uVar11 = 0x7ffffffffffffff;
    }
    if (CARRY8(uVar4,uVar9)) {
      uVar11 = 0x7ffffffffffffff;
    }
    if (uVar11 == 0) {
      psVar5 = (pointer)0x0;
      pPVar7 = local_70;
    }
    else {
      psVar5 = (pointer)operator_new(uVar11 << 4);
      pPVar7 = extraout_RDX;
    }
    std::
    allocator_traits<std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo>>>
    ::
    construct<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo>,testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo*>
              ((allocator_type *)(psVar5 + uVar9),&local_40,(TestInfo **)pPVar7);
    pPVar7 = local_70;
    psVar8 = psVar5;
    for (_Var6._M_pi = local_40.
                       super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi; __a != _Var6._M_pi; _Var6._M_pi = _Var6._M_pi + 1) {
      (psVar8->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = (element_type *)(_Var6._M_pi)->_vptr__Sp_counted_base;
      (psVar8->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(_Var6._M_pi)->_M_use_count;
      (_Var6._M_pi)->_M_use_count = 0;
      (_Var6._M_pi)->_M_weak_count = 0;
      (psVar8->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_refcount._M_pi = p_Var3;
      (_Var6._M_pi)->_vptr__Sp_counted_base = (_func_int **)0x0;
      psVar8 = psVar8 + 1;
    }
    if (local_40.
        super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      operator_delete(local_40.
                      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi,
                      (long)(local_70->tests_).
                            super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_40.
                            super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi);
    }
    (pPVar7->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_start = psVar5;
    (pPVar7->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar8 + 1;
    (pPVar7->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar5 + uVar11;
  }
  else {
    std::
    allocator_traits<std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo>>>
    ::
    construct<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo>,testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo*>
              ((allocator_type *)__a,&local_40,(TestInfo **)local_70);
    ppsVar2 = &(local_70->tests_).
               super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppsVar2 = *ppsVar2 + 1;
  }
  if (local_68 != &local_58) {
    operator_delete(local_68,(long)local_58._vptr_TestMetaFactoryBase + 1);
  }
  return;
}

Assistant:

void AddTestPattern(const char*,
                      const char* test_base_name,
                      TestMetaFactoryBase<ParamType>* meta_factory,
                      CodeLocation code_location) {
    tests_.emplace_back(
        new TestInfo(test_base_name, meta_factory, std::move(code_location)));
  }